

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O1

vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_> * __thiscall
kratos::FSM::get_all_child_fsm
          (vector<kratos::FSM_*,_std::allocator<kratos::FSM_*>_> *__return_storage_ptr__,FSM *this)

{
  undefined1 local_100 [8];
  unordered_set<const_kratos::FSM_*,_std::hash<const_kratos::FSM_*>,_std::equal_to<const_kratos::FSM_*>,_std::allocator<const_kratos::FSM_*>_>
  visited;
  queue<kratos::FSM_*,_std::deque<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>_> queue;
  FSM *local_70;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::FSM_*>_>_>
  children;
  FSM *fsm;
  
  (__return_storage_ptr__->super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  visited._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::_Deque_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>::_M_initialize_map
            ((_Deque_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_> *)
             &visited._M_h._M_single_bucket,0);
  local_100 = (undefined1  [8])&visited._M_h._M_rehash_policy._M_next_resize;
  visited._M_h._M_buckets = (__buckets_ptr)0x1;
  visited._M_h._M_bucket_count = 0;
  visited._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  visited._M_h._M_element_count._0_4_ = 0x3f800000;
  visited._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  visited._M_h._M_rehash_policy._4_4_ = 0;
  visited._M_h._M_rehash_policy._M_next_resize = 0;
  local_70 = this;
  children._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  std::deque<kratos::FSM*,std::allocator<kratos::FSM*>>::emplace_back<kratos::FSM*>
            ((deque<kratos::FSM*,std::allocator<kratos::FSM*>> *)&visited._M_h._M_single_bucket,
             &local_70);
  std::
  _Hashtable<const_kratos::FSM_*,_const_kratos::FSM_*,_std::allocator<const_kratos::FSM_*>,_std::__detail::_Identity,_std::equal_to<const_kratos::FSM_*>,_std::hash<const_kratos::FSM_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<const_kratos::FSM_*,_const_kratos::FSM_*,_std::allocator<const_kratos::FSM_*>,_std::__detail::_Identity,_std::equal_to<const_kratos::FSM_*>,_std::hash<const_kratos::FSM_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_100);
  std::_Deque_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_>::~_Deque_base
            ((_Deque_base<kratos::FSM_*,_std::allocator<kratos::FSM_*>_> *)
             &visited._M_h._M_single_bucket);
  return __return_storage_ptr__;
}

Assistant:

std::vector<FSM*> FSM::get_all_child_fsm() const {
    std::vector<FSM*> result;
    std::queue<FSM*> queue;
    std::unordered_set<const FSM*> visited;
    queue.emplace(const_cast<FSM*>(this));
    while (!queue.empty()) {
        auto* fsm = queue.front();
        queue.pop();
        result.emplace_back(fsm);
        if (visited.find(fsm) != visited.end())
            throw UserException(::format("FSM {0} has circular dependency", fsm_name_));

        visited.emplace(fsm);
        auto children = fsm->child_fsms_;
        for (auto const& iter : children) queue.emplace(iter.second);
    }
    return result;
}